

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O3

bool Imf_3_4::checkOpenEXRFile
               (char *data,size_t numBytes,bool reduceMemory,bool reduceTime,bool runCoreCheck)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint *puVar9;
  Header *pHVar10;
  ulong uVar11;
  bool reduceTime_00;
  bool reduceTime_01;
  bool reduceTime_02;
  undefined3 in_register_00000081;
  exr_context_t f;
  int maxTileHeight;
  int maxTileWidth;
  int maxImageHeight;
  int maxImageWidth;
  MultiPartInputFile multi;
  PtrIStream stream;
  exr_context_t local_110;
  size_t local_108;
  _priv_exr_context_t local_100;
  undefined7 uStack_ff;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  undefined8 local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  undefined8 local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c8;
  undefined ***local_c0;
  code *pcStack_b8;
  code *local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  long local_78;
  undefined **local_70;
  size_t local_68;
  char *local_48;
  char *local_40;
  char *local_38;
  
  if (CONCAT31(in_register_00000081,runCoreCheck) != 0) {
    local_90 = 0;
    local_a0 = 0;
    uStack_98 = 0;
    uStack_a8 = 0;
    local_d0 = 0;
    p_Stack_c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_80 = 0;
    local_e0 = 0x68;
    uStack_88 = 0xbf800000fffffffe;
    local_c0 = &local_70;
    pcStack_b8 = anon_unknown_0::memstream_read;
    local_b0 = anon_unknown_0::memstream_size;
    local_d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_unknown_0::core_error_handler_cb
    ;
    if (reduceMemory || reduceTime) {
      uStack_98 = 0x80000000800;
      local_90 = 0x20000000200;
    }
    local_70 = (undefined **)data;
    local_68 = numBytes;
    iVar7 = exr_start_read(&local_110,"<memstream>",&local_e0);
    if (iVar7 != 0) {
      return true;
    }
    bVar3 = anon_unknown_0::checkCoreFile(local_110,reduceMemory,reduceTime);
    exr_finish(&local_110);
    return bVar3;
  }
  Imf_3_4::IStream::IStream((IStream *)&local_70,"none");
  local_70 = &PTR__IStream_001295d8;
  local_38 = data + numBytes;
  local_48 = data;
  local_40 = data;
  local_78 = Imf_3_4::CompositeDeepScanLine::getMaximumSampleCount();
  Imf_3_4::Header::getMaxImageSize(&local_e4,&local_e8);
  Imf_3_4::Header::getMaxImageSize(&local_ec,&local_f0);
  iVar7 = 0x4000;
  if (reduceMemory || reduceTime) {
    Imf_3_4::CompositeDeepScanLine::setMaximumSampleCount(0x100000);
    iVar7 = 0x200;
    Imf_3_4::Header::setMaxImageSize(0x800,0x800);
  }
  Imf_3_4::Header::setMaxTileSize(iVar7,iVar7);
  local_108 = 0;
  local_100 = (_priv_exr_context_t)0x0;
  local_110 = &local_100;
  iVar7 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)&local_e0,(IStream *)&local_70,iVar7,true);
  Imf_3_4::MultiPartInputFile::header((int)&local_e0);
  Imf_3_4::Header::type_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&local_110);
  cVar4 = Imf_3_4::isTiled((string *)&local_110);
  if (cVar4 == '\0') {
    bVar3 = false;
  }
  else {
    Imf_3_4::MultiPartInputFile::header((int)&local_e0);
    puVar9 = (uint *)Imf_3_4::Header::tileDescription();
    uVar1 = *puVar9;
    uVar2 = puVar9[1];
    pHVar10 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&local_e0);
    iVar7 = Imf_3_4::calculateBytesPerPixel(pHVar10);
    if ((local_108 == DAT_0012aa60) &&
       ((local_108 == 0 || (iVar8 = bcmp(local_110,DEEPTILE_abi_cxx11_,local_108), iVar8 == 0)))) {
      uVar11 = 4;
      if (4 < (ulong)(long)iVar7) {
        uVar11 = (long)iVar7;
      }
    }
    else {
      uVar11 = (long)iVar7;
    }
    bVar3 = 1000000 < (ulong)uVar2 * (ulong)uVar1 * uVar11;
  }
  bVar5 = anon_unknown_0::readMultiPart((MultiPartInputFile *)&local_e0,reduceMemory,reduceTime);
  if (p_Stack_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c8);
  }
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
  }
  if (reduceMemory) {
    if (bVar3) goto LAB_0011169c;
  }
  else {
    (*(code *)local_70[6])(&local_70,0);
    iVar7 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&local_e0,(IStream *)&local_70,iVar7);
    bVar6 = anon_unknown_0::readRgba((RgbaInputFile *)&local_e0,reduceTime,reduceTime_00);
    Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&local_e0);
    if ((bVar6) &&
       ((local_108 != DAT_0012aa60 ||
        ((local_108 != 0 && (iVar7 = bcmp(local_110,DEEPTILE_abi_cxx11_,local_108), iVar7 != 0))))))
    {
      bVar5 = true;
    }
    (*(code *)local_70[6])(&local_70,0);
    iVar7 = Imf_3_4::globalThreadCount();
    Imf_3_4::InputFile::InputFile((InputFile *)&local_e0,(IStream *)&local_70,iVar7);
    bVar6 = anon_unknown_0::readScanline<Imf_3_4::InputFile>
                      ((InputFile *)&local_e0,reduceTime,reduceTime_01);
    if (p_Stack_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c8);
    }
    if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
    }
    if ((bVar6) &&
       ((local_108 != DAT_0012aa60 ||
        ((local_108 != 0 && (iVar7 = bcmp(local_110,DEEPTILE_abi_cxx11_,local_108), iVar7 != 0))))))
    {
      bVar5 = true;
    }
  }
  (*(code *)local_70[6])(&local_70,0);
  iVar7 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&local_e0,(IStream *)&local_70,iVar7);
  bVar6 = anon_unknown_0::readTile<Imf_3_4::TiledInputFile>
                    ((TiledInputFile *)&local_e0,reduceMemory,reduceTime);
  if (p_Stack_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c8);
  }
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
  }
  if (((bVar6) && (local_108 == DAT_0012aa20)) &&
     ((local_108 == 0 || (iVar7 = bcmp(local_110,TILEDIMAGE_abi_cxx11_,local_108), iVar7 == 0)))) {
    bVar5 = true;
  }
  if (reduceMemory) {
    if (bVar3) goto LAB_0011169c;
  }
  else {
    (*(code *)local_70[6])(&local_70,0);
    iVar7 = Imf_3_4::globalThreadCount();
    Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
              ((DeepScanLineInputFile *)&local_e0,(IStream *)&local_70,iVar7);
    bVar3 = anon_unknown_0::readDeepScanLine<Imf_3_4::DeepScanLineInputFile>
                      ((DeepScanLineInputFile *)&local_e0,reduceTime,reduceTime_02);
    if (p_Stack_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c8);
    }
    if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
    }
    if (((bVar3) && (local_108 == DAT_0012aa40)) &&
       ((local_108 == 0 || (iVar7 = bcmp(local_110,DEEPSCANLINE_abi_cxx11_,local_108), iVar7 == 0)))
       ) {
      bVar5 = true;
    }
  }
  (*(code *)local_70[6])(&local_70,0);
  iVar7 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepTiledInputFile::DeepTiledInputFile
            ((DeepTiledInputFile *)&local_e0,(IStream *)&local_70,iVar7);
  bVar3 = anon_unknown_0::readDeepTile<Imf_3_4::DeepTiledInputFile>
                    ((DeepTiledInputFile *)&local_e0,reduceMemory,reduceTime);
  if (p_Stack_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c8);
  }
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
  }
  if (((bVar3) && (local_108 == DAT_0012aa60)) &&
     ((local_108 == 0 || (iVar7 = bcmp(local_110,DEEPTILE_abi_cxx11_,local_108), iVar7 == 0)))) {
    bVar5 = true;
  }
LAB_0011169c:
  Imf_3_4::CompositeDeepScanLine::setMaximumSampleCount(local_78);
  Imf_3_4::Header::setMaxImageSize(local_e4,local_e8);
  Imf_3_4::Header::setMaxTileSize(local_ec,local_f0);
  if (local_110 != &local_100) {
    operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
  }
  Imf_3_4::IStream::~IStream((IStream *)&local_70);
  return bVar5;
}

Assistant:

bool
checkOpenEXRFile (
    const char* data,
    size_t      numBytes,
    bool        reduceMemory,
    bool        reduceTime,
    bool        runCoreCheck)
{

    if (runCoreCheck)
    {
        return runCoreChecks (data, numBytes, reduceMemory, reduceTime);
    }
    else
    {
        PtrIStream stream (data, numBytes);
        return runChecks (stream, reduceMemory, reduceTime);
    }
}